

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsysinfo.cpp
# Opt level: O0

QString * QSysInfo::productType(void)

{
  long lVar1;
  bool bVar2;
  QString *in_RDI;
  long in_FS_OFFSET;
  QUnixOSVersion unixOsVersion;
  QUnixOSVersion *in_stack_ffffffffffffff68;
  QUnixOSVersion *in_stack_ffffffffffffff70;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QUnixOSVersion::QUnixOSVersion(in_stack_ffffffffffffff70);
  findUnixOsVersion(in_stack_ffffffffffffff68);
  bVar2 = QString::isEmpty((QString *)0x25ad00);
  if (bVar2) {
    unknownText();
  }
  else {
    QString::QString(&in_stack_ffffffffffffff70->productType,&in_stack_ffffffffffffff68->productType
                    );
  }
  QUnixOSVersion::~QUnixOSVersion(in_stack_ffffffffffffff70);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QString QSysInfo::productType()
{
    // similar, but not identical to QFileSelectorPrivate::platformSelectors
#if defined(Q_OS_WIN)
    return QStringLiteral("windows");

#elif defined(Q_OS_QNX)
    return QStringLiteral("qnx");

#elif defined(Q_OS_ANDROID)
    return QStringLiteral("android");

#elif defined(Q_OS_IOS)
    return QStringLiteral("ios");
#elif defined(Q_OS_TVOS)
    return QStringLiteral("tvos");
#elif defined(Q_OS_WATCHOS)
    return QStringLiteral("watchos");
#elif defined(Q_OS_VISIONOS)
    return QStringLiteral("visionos");
#elif defined(Q_OS_MACOS)
    return QStringLiteral("macos");
#elif defined(Q_OS_DARWIN)
    return QStringLiteral("darwin");
#elif defined(Q_OS_WASM)
    return QStringLiteral("wasm");
#elif defined(Q_OS_VXWORKS)
    return QStringLiteral("vxworks");

#elif defined(USE_ETC_OS_RELEASE) // Q_OS_UNIX
    QUnixOSVersion unixOsVersion;
    findUnixOsVersion(unixOsVersion);
    if (!unixOsVersion.productType.isEmpty())
        return unixOsVersion.productType;
#endif
    return unknownText();
}